

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

SRes LzmaDec_DecodeToDic(CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  UInt16 *pUVar2;
  Byte *pBVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ELzmaDummy EVar7;
  uint uVar8;
  ELzmaStatus EVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ELzmaStatus *pEVar16;
  ulong uVar17;
  Byte *pBVar18;
  SizeT inSize;
  bool bVar19;
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  int iVar41;
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  undefined1 auVar43 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  Byte *local_48;
  
  inSize = *srcLen;
  *srcLen = 0;
  pEVar16 = status;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  auVar49 = _DAT_005d8eb0;
  do {
    uVar15 = (uint)pEVar16;
    uVar6 = p->remainLen;
    if (uVar6 == 0x112) {
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(p->code != 0);
    }
    if (p->needFlush == 0) {
LAB_005d2717:
      uVar13 = p->dicPos;
      if (uVar13 < dicLimit) {
LAB_005d2754:
        if (p->needInitState != 0) {
          uVar6 = 0x300 << ((char)(p->prop).lp + (char)(p->prop).lc & 0x1fU);
          pUVar2 = p->probs;
          lVar10 = (ulong)uVar6 + 0x735;
          auVar20._8_4_ = (int)lVar10;
          auVar20._0_8_ = lVar10;
          auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar20 = auVar20 ^ auVar49;
          uVar11 = 0;
          auVar23 = _DAT_00632e10;
          auVar24 = _DAT_00632e00;
          auVar25 = _DAT_00632df0;
          auVar26 = _DAT_00632de0;
          do {
            auVar27 = auVar23 ^ auVar49;
            iVar41 = auVar20._0_4_;
            iVar40 = -(uint)(iVar41 < auVar27._0_4_);
            iVar21 = auVar20._4_4_;
            auVar28._4_4_ = -(uint)(iVar21 < auVar27._4_4_);
            iVar45 = auVar20._8_4_;
            iVar44 = -(uint)(iVar45 < auVar27._8_4_);
            iVar22 = auVar20._12_4_;
            auVar28._12_4_ = -(uint)(iVar22 < auVar27._12_4_);
            auVar37._4_4_ = iVar40;
            auVar37._0_4_ = iVar40;
            auVar37._8_4_ = iVar44;
            auVar37._12_4_ = iVar44;
            auVar46 = pshuflw(in_XMM8,auVar37,0xe8);
            auVar30._4_4_ = -(uint)(auVar27._4_4_ == iVar21);
            auVar30._12_4_ = -(uint)(auVar27._12_4_ == iVar22);
            auVar30._0_4_ = auVar30._4_4_;
            auVar30._8_4_ = auVar30._12_4_;
            auVar48 = pshuflw(in_XMM9,auVar30,0xe8);
            auVar28._0_4_ = auVar28._4_4_;
            auVar28._8_4_ = auVar28._12_4_;
            auVar47 = pshuflw(auVar46,auVar28,0xe8);
            auVar27._8_4_ = 0xffffffff;
            auVar27._0_8_ = 0xffffffffffffffff;
            auVar27._12_4_ = 0xffffffff;
            auVar27 = (auVar47 | auVar48 & auVar46) ^ auVar27;
            auVar27 = packssdw(auVar27,auVar27);
            if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pUVar2[uVar11] = 0x400;
            }
            auVar28 = auVar30 & auVar37 | auVar28;
            auVar27 = packssdw(auVar28,auVar28);
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            auVar27 = packssdw(auVar27 ^ auVar47,auVar27 ^ auVar47);
            if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
              pUVar2[uVar11 + 1] = 0x400;
            }
            auVar27 = auVar24 ^ auVar49;
            iVar40 = -(uint)(iVar41 < auVar27._0_4_);
            auVar42._4_4_ = -(uint)(iVar21 < auVar27._4_4_);
            iVar44 = -(uint)(iVar45 < auVar27._8_4_);
            auVar42._12_4_ = -(uint)(iVar22 < auVar27._12_4_);
            auVar29._4_4_ = iVar40;
            auVar29._0_4_ = iVar40;
            auVar29._8_4_ = iVar44;
            auVar29._12_4_ = iVar44;
            auVar36._4_4_ = -(uint)(auVar27._4_4_ == iVar21);
            auVar36._12_4_ = -(uint)(auVar27._12_4_ == iVar22);
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar27 = auVar36 & auVar29 | auVar42;
            auVar27 = packssdw(auVar27,auVar27);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar27 = packssdw(auVar27 ^ auVar4,auVar27 ^ auVar4);
            if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pUVar2[uVar11 + 2] = 0x400;
            }
            auVar30 = pshufhw(auVar29,auVar29,0x84);
            auVar37 = pshufhw(auVar36,auVar36,0x84);
            auVar28 = pshufhw(auVar30,auVar42,0x84);
            auVar31._8_4_ = 0xffffffff;
            auVar31._0_8_ = 0xffffffffffffffff;
            auVar31._12_4_ = 0xffffffff;
            auVar31 = (auVar28 | auVar37 & auVar30) ^ auVar31;
            auVar30 = packssdw(auVar31,auVar31);
            if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pUVar2[uVar11 + 3] = 0x400;
            }
            auVar30 = auVar25 ^ auVar49;
            iVar40 = -(uint)(iVar41 < auVar30._0_4_);
            auVar33._4_4_ = -(uint)(iVar21 < auVar30._4_4_);
            iVar44 = -(uint)(iVar45 < auVar30._8_4_);
            auVar33._12_4_ = -(uint)(iVar22 < auVar30._12_4_);
            auVar38._4_4_ = iVar40;
            auVar38._0_4_ = iVar40;
            auVar38._8_4_ = iVar44;
            auVar38._12_4_ = iVar44;
            auVar27 = pshuflw(auVar27,auVar38,0xe8);
            auVar32._4_4_ = -(uint)(auVar30._4_4_ == iVar21);
            auVar32._12_4_ = -(uint)(auVar30._12_4_ == iVar22);
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            in_XMM9 = pshuflw(auVar48 & auVar46,auVar32,0xe8);
            in_XMM9 = in_XMM9 & auVar27;
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar27 = pshuflw(auVar27,auVar33,0xe8);
            auVar46._8_4_ = 0xffffffff;
            auVar46._0_8_ = 0xffffffffffffffff;
            auVar46._12_4_ = 0xffffffff;
            auVar46 = (auVar27 | in_XMM9) ^ auVar46;
            auVar27 = packssdw(auVar46,auVar46);
            if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pUVar2[uVar11 + 4] = 0x400;
            }
            auVar33 = auVar32 & auVar38 | auVar33;
            auVar27 = packssdw(auVar33,auVar33);
            auVar48._8_4_ = 0xffffffff;
            auVar48._0_8_ = 0xffffffffffffffff;
            auVar48._12_4_ = 0xffffffff;
            auVar27 = packssdw(auVar27 ^ auVar48,auVar27 ^ auVar48);
            if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pUVar2[uVar11 + 5] = 0x400;
            }
            auVar27 = auVar26 ^ auVar49;
            iVar41 = -(uint)(iVar41 < auVar27._0_4_);
            auVar43._4_4_ = -(uint)(iVar21 < auVar27._4_4_);
            iVar45 = -(uint)(iVar45 < auVar27._8_4_);
            auVar43._12_4_ = -(uint)(iVar22 < auVar27._12_4_);
            auVar34._4_4_ = iVar41;
            auVar34._0_4_ = iVar41;
            auVar34._8_4_ = iVar45;
            auVar34._12_4_ = iVar45;
            auVar39._4_4_ = -(uint)(auVar27._4_4_ == iVar21);
            auVar39._12_4_ = -(uint)(auVar27._12_4_ == iVar22);
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar43._0_4_ = auVar43._4_4_;
            auVar43._8_4_ = auVar43._12_4_;
            auVar27 = auVar39 & auVar34 | auVar43;
            auVar27 = packssdw(auVar27,auVar27);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar27 ^ auVar5,auVar27 ^ auVar5);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pUVar2[uVar11 + 6] = 0x400;
            }
            auVar27 = pshufhw(auVar34,auVar34,0x84);
            auVar28 = pshufhw(auVar39,auVar39,0x84);
            auVar30 = pshufhw(auVar27,auVar43,0x84);
            auVar35._8_4_ = 0xffffffff;
            auVar35._0_8_ = 0xffffffffffffffff;
            auVar35._12_4_ = 0xffffffff;
            auVar35 = (auVar30 | auVar28 & auVar27) ^ auVar35;
            auVar27 = packssdw(auVar35,auVar35);
            if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pUVar2[uVar11 + 7] = 0x400;
            }
            uVar11 = uVar11 + 8;
            lVar10 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 8;
            auVar23._8_8_ = lVar10 + 8;
            lVar10 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 8;
            auVar24._8_8_ = lVar10 + 8;
            lVar10 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 8;
            auVar25._8_8_ = lVar10 + 8;
            lVar10 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 8;
            auVar26._8_8_ = lVar10 + 8;
          } while (((ulong)(uVar6 + 0x700) | 0x38) != uVar11);
          p->reps[3] = 1;
          p->state = 0;
          p->reps[0] = 1;
          p->reps[1] = 1;
          p->reps[2] = 1;
          p->needInitState = 0;
        }
        uVar6 = p->tempBufSize;
        uVar11 = (ulong)uVar6;
        if (uVar11 == 0) {
          if (inSize < 0x14 || dicLimit <= uVar13) {
            pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
            EVar7 = LzmaDec_TryDummy(p,src,inSize);
            if (EVar7 == DUMMY_ERROR) {
              memcpy(buf,src,inSize);
              p->tempBufSize = (uint)inSize;
              *srcLen = *srcLen + inSize;
              pEVar16 = (ELzmaStatus *)0x0;
              EVar9 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_005d2c60:
              *status = EVar9;
              bVar19 = false;
              pBVar18 = local_48;
            }
            else {
              bVar19 = true;
              pBVar18 = src;
              if ((dicLimit <= uVar13) && (EVar7 != DUMMY_MATCH)) {
                pEVar16 = (ELzmaStatus *)0x1;
                EVar9 = LZMA_STATUS_NOT_FINISHED;
                goto LAB_005d2c60;
              }
            }
            if (bVar19) {
              uVar15 = (uint)pEVar16;
              goto LAB_005d2c75;
            }
            bVar19 = false;
          }
          else {
            pBVar18 = src + (inSize - 0x14);
LAB_005d2c75:
            p->buf = src;
            iVar41 = LzmaDec_DecodeReal2(p,dicLimit,pBVar18);
            if (iVar41 == 0) {
              pBVar3 = p->buf;
              lVar10 = (long)pBVar3 - (long)src;
              *srcLen = *srcLen + lVar10;
              inSize = inSize - lVar10;
              bVar19 = true;
              pEVar16 = (ELzmaStatus *)(ulong)uVar15;
              src = pBVar3;
            }
            else {
              pEVar16 = (ELzmaStatus *)0x1;
              bVar19 = false;
            }
          }
          auVar49 = _DAT_005d8eb0;
          local_48 = pBVar18;
          if (!bVar19) {
            bVar19 = false;
            goto LAB_005d2d03;
          }
        }
        else {
          uVar12 = 0;
          bVar19 = uVar6 < 0x14;
          if (bVar19) {
            uVar17 = 0;
            if (inSize != 0) {
              uVar17 = 0;
              do {
                pBVar18 = src + uVar17;
                uVar17 = uVar17 + 1;
                p->tempBuf[uVar11] = *pBVar18;
                bVar19 = uVar11 < 0x13;
                if (!bVar19) break;
                uVar11 = uVar11 + 1;
              } while (uVar17 < inSize);
              uVar11 = (ulong)(uVar6 + (int)uVar17);
              uVar12 = uVar17 & 0xffffffff;
            }
          }
          else {
            uVar17 = 0;
          }
          uVar6 = (uint)uVar11;
          p->tempBufSize = uVar6;
          if ((bool)(uVar13 < dicLimit & (bVar19 ^ 1U))) {
LAB_005d2b76:
            p->buf = buf;
            iVar41 = LzmaDec_DecodeReal2(p,dicLimit,buf);
            auVar49 = _DAT_005d8eb0;
            if (iVar41 != 0) {
              pEVar16 = (ELzmaStatus *)0x1;
              goto LAB_005d2be6;
            }
            uVar8 = *(int *)&p->buf - (int)buf;
            pEVar16 = (ELzmaStatus *)0xb;
            uVar14 = uVar6 - uVar8;
            if (uVar6 < uVar8) {
              bVar19 = false;
            }
            else if ((uint)uVar12 < uVar14) {
              bVar19 = false;
            }
            else {
              bVar19 = true;
              uVar12 = (ulong)((uint)uVar12 - uVar14);
              pEVar16 = (ELzmaStatus *)(ulong)uVar15;
            }
            if (bVar19) {
              *srcLen = *srcLen + uVar12;
              src = src + uVar12;
              inSize = inSize - uVar12;
              p->tempBufSize = 0;
              bVar19 = true;
            }
            else {
              bVar19 = false;
            }
          }
          else {
            EVar7 = LzmaDec_TryDummy(p,buf,uVar11);
            if (EVar7 == DUMMY_ERROR) {
              *srcLen = *srcLen + uVar17;
              pEVar16 = (ELzmaStatus *)0x0;
              EVar9 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_005d2b69:
              auVar49 = _DAT_005d8eb0;
              *status = EVar9;
              bVar19 = false;
            }
            else {
              bVar19 = true;
              auVar49 = _DAT_005d8eb0;
              if (uVar13 < dicLimit) {
                pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
              }
              else {
                pEVar16 = (ELzmaStatus *)((ulong)pEVar16 & 0xffffffff);
                if (EVar7 != DUMMY_MATCH) {
                  pEVar16 = (ELzmaStatus *)0x1;
                  EVar9 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_005d2b69;
                }
              }
            }
            uVar15 = (uint)pEVar16;
            if (bVar19) goto LAB_005d2b76;
LAB_005d2be6:
            bVar19 = false;
          }
          if (!bVar19) goto LAB_005d2bfc;
        }
        bVar19 = true;
      }
      else {
        if ((uVar6 == 0) && (p->code == 0)) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        }
        else {
          if (finishMode != LZMA_FINISH_ANY) {
            if (uVar6 != 0) {
              *status = LZMA_STATUS_NOT_FINISHED;
              goto LAB_005d2749;
            }
            goto LAB_005d2754;
          }
          *status = LZMA_STATUS_NOT_FINISHED;
        }
LAB_005d2c0e:
        bVar19 = false;
        pEVar16 = (ELzmaStatus *)0x0;
      }
    }
    else {
      if (inSize != 0) {
        uVar8 = p->tempBufSize;
        uVar11 = 5;
        uVar13 = (ulong)uVar8;
        if (5 < uVar8) {
          uVar11 = (ulong)uVar8;
        }
        do {
          if (uVar11 == uVar13) break;
          BVar1 = *src;
          p->tempBufSize = (uint)(uVar13 + 1);
          p->tempBuf[uVar13] = BVar1;
          *srcLen = *srcLen + 1;
          src = src + 1;
          inSize = inSize - 1;
          uVar13 = uVar13 + 1;
        } while (inSize != 0);
      }
      if (p->tempBufSize < 5) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        goto LAB_005d2c0e;
      }
      if (p->tempBuf[0] == '\0') {
        uVar8 = *(uint *)(p->tempBuf + 1);
        p->code = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
        goto LAB_005d2717;
      }
LAB_005d2749:
      pEVar16 = (ELzmaStatus *)0x1;
LAB_005d2bfc:
      bVar19 = false;
    }
LAB_005d2d03:
    if (!bVar19) {
      return (SRes)pEVar16;
    }
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec *p, SizeT dicLimit, const Byte *src, SizeT *srcLen,
    ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);
  
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart)
  {
      int checkEndMarkNow;

      if (p->needFlush)
      {
        for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
          p->tempBuf[p->tempBufSize++] = *src++;
        if (p->tempBufSize < RC_INIT_SIZE)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (p->tempBuf[0] != 0)
          return SZ_ERROR_DATA;
        p->code =
              ((UInt32)p->tempBuf[1] << 24)
            | ((UInt32)p->tempBuf[2] << 16)
            | ((UInt32)p->tempBuf[3] << 8)
            | ((UInt32)p->tempBuf[4]);
        p->range = 0xFFFFFFFF;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }

      checkEndMarkNow = 0;
      if (p->dicPos >= dicLimit)
      {
        if (p->remainLen == 0 && p->code == 0)
        {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return SZ_OK;
        }
        if (finishMode == LZMA_FINISH_ANY)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_OK;
        }
        if (p->remainLen != 0)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        checkEndMarkNow = 1;
      }

      if (p->needInitState)
        LzmaDec_InitStateReal(p);
  
      if (p->tempBufSize == 0)
      {
        SizeT processed;
        const Byte *bufLimit;
        if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, src, inSize);
          if (dummyRes == DUMMY_ERROR)
          {
            memcpy(p->tempBuf, src, inSize);
            p->tempBufSize = (unsigned)inSize;
            (*srcLen) += inSize;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
          bufLimit = src;
        }
        else
          bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
        p->buf = src;
        if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
          return SZ_ERROR_DATA;
        processed = (SizeT)(p->buf - src);
        (*srcLen) += processed;
        src += processed;
        inSize -= processed;
      }
      else
      {
        unsigned rem = p->tempBufSize, lookAhead = 0;
        while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
          p->tempBuf[rem++] = src[lookAhead++];
        p->tempBufSize = rem;
        if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
          if (dummyRes == DUMMY_ERROR)
          {
            (*srcLen) += lookAhead;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
        }
        p->buf = p->tempBuf;
        if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
          return SZ_ERROR_DATA;
        
        {
          unsigned kkk = (unsigned)(p->buf - p->tempBuf);
          if (rem < kkk)
            return SZ_ERROR_FAIL; /* some internal error */
          rem -= kkk;
          if (lookAhead < rem)
            return SZ_ERROR_FAIL; /* some internal error */
          lookAhead -= rem;
        }
        (*srcLen) += lookAhead;
        src += lookAhead;
        inSize -= lookAhead;
        p->tempBufSize = 0;
      }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}